

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuaternion.h
# Opt level: O2

cbtQuaternion operator*(cbtQuaternion *q1,cbtQuaternion *q2)

{
  cbtScalar cVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  cbtQuaternion cVar11;
  
  cVar1 = (q1->super_cbtQuadWord).m_floats[0];
  uVar2 = *(ulong *)((q1->super_cbtQuadWord).m_floats + 1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar3 = *(undefined1 (*) [16])(q2->super_cbtQuadWord).m_floats;
  auVar8._0_4_ = -cVar1;
  auVar8._4_4_ = 0x80000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._12_4_ = 0x80000000;
  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)cVar1),0x20);
  auVar5 = vshufps_avx(auVar3,auVar3,0x3f);
  auVar7._0_8_ = uVar2 ^ 0x8000000080000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar6 = vshufps_avx(auVar3,auVar3,0xc9);
  auVar4 = vinsertps_avx(auVar9,auVar8,0x30);
  auVar10._0_4_ = auVar5._0_4_ * auVar4._0_4_;
  auVar10._4_4_ = auVar5._4_4_ * auVar4._4_4_;
  auVar10._8_4_ = auVar5._8_4_ * auVar4._8_4_;
  auVar10._12_4_ = auVar5._12_4_ * auVar4._12_4_;
  cVar1 = (q1->super_cbtQuadWord).m_floats[3];
  auVar4._4_4_ = cVar1;
  auVar4._0_4_ = cVar1;
  auVar4._8_4_ = cVar1;
  auVar4._12_4_ = cVar1;
  auVar4 = vfmadd231ps_avx512vl(auVar10,auVar6,auVar4);
  auVar5 = vpermi2ps_avx512vl(_DAT_00f5d6c0,auVar9,auVar7);
  auVar9 = vshufps_avx(auVar3,auVar3,100);
  auVar6 = vpermi2ps_avx512vl(_DAT_00f5d6d0,auVar7,auVar8);
  auVar3 = vshufps_avx(auVar3,auVar3,0x92);
  auVar9 = vfmadd213ps_fma(auVar9,auVar5,auVar4);
  auVar9 = vfmadd213ps_fma(auVar3,auVar6,auVar9);
  auVar3 = vshufps_avx(auVar9,auVar9,0xe2);
  auVar9 = vshufps_avx(auVar9,auVar9,0xed);
  cVar11.super_cbtQuadWord.m_floats._0_8_ = auVar3._0_8_;
  cVar11.super_cbtQuadWord.m_floats._8_8_ = auVar9._0_8_;
  return (cbtQuaternion)cVar11.super_cbtQuadWord.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtQuaternion
operator*(const cbtQuaternion& q1, const cbtQuaternion& q2)
{
#if defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
	__m128 vQ1 = q1.get128();
	__m128 vQ2 = q2.get128();
	__m128 A0, A1, B1, A2, B2;

	A1 = bt_pshufd_ps(vQ1, BT_SHUFFLE(0, 1, 2, 0));  // X Y  z x     //      vtrn
	B1 = bt_pshufd_ps(vQ2, BT_SHUFFLE(3, 3, 3, 0));  // W W  W X     // vdup vext

	A1 = A1 * B1;

	A2 = bt_pshufd_ps(vQ1, BT_SHUFFLE(1, 2, 0, 1));  // Y Z  X Y     // vext
	B2 = bt_pshufd_ps(vQ2, BT_SHUFFLE(2, 0, 1, 1));  // z x  Y Y     // vtrn vdup

	A2 = A2 * B2;

	B1 = bt_pshufd_ps(vQ1, BT_SHUFFLE(2, 0, 1, 2));  // z x Y Z      // vtrn vext
	B2 = bt_pshufd_ps(vQ2, BT_SHUFFLE(1, 2, 0, 2));  // Y Z x z      // vext vtrn

	B1 = B1 * B2;  //	A3 *= B3

	A0 = bt_splat_ps(vQ1, 3);  //	A0
	A0 = A0 * vQ2;             //	A0 * B0

	A1 = A1 + A2;  //	AB12
	A0 = A0 - B1;  //	AB03 = AB0 - AB3

	A1 = _mm_xor_ps(A1, vPPPM);  //	change sign of the last element
	A0 = A0 + A1;                //	AB03 + AB12

	return cbtQuaternion(A0);

#elif defined(BT_USE_NEON)

	float32x4_t vQ1 = q1.get128();
	float32x4_t vQ2 = q2.get128();
	float32x4_t A0, A1, B1, A2, B2, A3, B3;
	float32x2_t vQ1zx, vQ2wx, vQ1yz, vQ2zx, vQ2yz, vQ2xz;

	{
		float32x2x2_t tmp;
		tmp = vtrn_f32(vget_high_f32(vQ1), vget_low_f32(vQ1));  // {z x}, {w y}
		vQ1zx = tmp.val[0];

		tmp = vtrn_f32(vget_high_f32(vQ2), vget_low_f32(vQ2));  // {z x}, {w y}
		vQ2zx = tmp.val[0];
	}
	vQ2wx = vext_f32(vget_high_f32(vQ2), vget_low_f32(vQ2), 1);

	vQ1yz = vext_f32(vget_low_f32(vQ1), vget_high_f32(vQ1), 1);

	vQ2yz = vext_f32(vget_low_f32(vQ2), vget_high_f32(vQ2), 1);
	vQ2xz = vext_f32(vQ2zx, vQ2zx, 1);

	A1 = vcombine_f32(vget_low_f32(vQ1), vQ1zx);                     // X Y  z x
	B1 = vcombine_f32(vdup_lane_f32(vget_high_f32(vQ2), 1), vQ2wx);  // W W  W X

	A2 = vcombine_f32(vQ1yz, vget_low_f32(vQ1));
	B2 = vcombine_f32(vQ2zx, vdup_lane_f32(vget_low_f32(vQ2), 1));

	A3 = vcombine_f32(vQ1zx, vQ1yz);  // Z X Y Z
	B3 = vcombine_f32(vQ2yz, vQ2xz);  // Y Z x z

	A1 = vmulq_f32(A1, B1);
	A2 = vmulq_f32(A2, B2);
	A3 = vmulq_f32(A3, B3);                           //	A3 *= B3
	A0 = vmulq_lane_f32(vQ2, vget_high_f32(vQ1), 1);  //	A0 * B0

	A1 = vaddq_f32(A1, A2);  //	AB12 = AB1 + AB2
	A0 = vsubq_f32(A0, A3);  //	AB03 = AB0 - AB3

	//	change the sign of the last element
	A1 = (cbtSimdFloat4)veorq_s32((int32x4_t)A1, (int32x4_t)vPPPM);
	A0 = vaddq_f32(A0, A1);  //	AB03 + AB12

	return cbtQuaternion(A0);

#else
	return cbtQuaternion(
		q1.w() * q2.x() + q1.x() * q2.w() + q1.y() * q2.z() - q1.z() * q2.y(),
		q1.w() * q2.y() + q1.y() * q2.w() + q1.z() * q2.x() - q1.x() * q2.z(),
		q1.w() * q2.z() + q1.z() * q2.w() + q1.x() * q2.y() - q1.y() * q2.x(),
		q1.w() * q2.w() - q1.x() * q2.x() - q1.y() * q2.y() - q1.z() * q2.z());
#endif
}